

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderCommonFunctionTests.cpp
# Opt level: O1

bool __thiscall
deqp::gles31::Functional::FloatBitsToUintIntCase::compare
          (FloatBitsToUintIntCase *this,void **inputs,void **outputs)

{
  Precision PVar1;
  pointer pSVar2;
  uint uVar3;
  int iVar4;
  ostream *poVar5;
  bool bVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  ostringstream *this_00;
  long lVar10;
  Hex<8UL> local_38;
  
  pSVar2 = (this->super_CommonFunctionCase).m_spec.inputs.
           super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  PVar1 = (pSVar2->varType).m_data.basic.precision;
  iVar4 = glu::getDataTypeScalarSize((pSVar2->varType).m_data.basic.type);
  bVar6 = iVar4 < 1;
  if (0 < iVar4) {
    uVar7 = ~(-1 << (0x17 - (&DAT_01c9564c)[(ulong)PVar1 * 4] & 0x1f));
    uVar9 = **inputs;
    uVar8 = **outputs - uVar9;
    uVar3 = -uVar8;
    if (0 < (int)uVar8) {
      uVar3 = uVar8;
    }
    lVar10 = 0;
    if ((int)uVar3 <= (int)uVar7) {
      lVar10 = 0;
      do {
        if (iVar4 + -1 == (int)lVar10) {
          return true;
        }
        uVar9 = *(uint *)((long)*inputs + (lVar10 + 1) * 4);
        uVar8 = *(int *)((long)*outputs + (lVar10 + 1) * 4) - uVar9;
        uVar3 = -uVar8;
        if (0 < (int)uVar8) {
          uVar3 = uVar8;
        }
        lVar10 = lVar10 + 1;
      } while ((int)uVar3 <= (int)uVar7);
      bVar6 = iVar4 <= (int)lVar10;
    }
    this_00 = &(this->super_CommonFunctionCase).m_failMsg;
    std::__ostream_insert<char,std::char_traits<char>>
              (&this_00->super_basic_ostream<char,_std::char_traits<char>_>,"Expected [",10);
    poVar5 = (ostream *)std::ostream::operator<<(this_00,(int)lVar10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"] = ",4);
    local_38.value = (deUint64)uVar9;
    poVar5 = tcu::Format::Hex<8UL>::toStream(&local_38,poVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," with threshold ",0x10);
    local_38.value = (deUint64)uVar7;
    poVar5 = tcu::Format::Hex<8UL>::toStream(&local_38,poVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,", got diff ",0xb);
    local_38.value = (ulong)uVar3;
    tcu::Format::Hex<8UL>::toStream(&local_38,poVar5);
  }
  return bVar6;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize		= glu::getDataTypeScalarSize(type);

		const int				mantissaBits	= getMinMantissaBits(precision);
		const int				maxUlpDiff		= getMaxUlpDiffFromBits(mantissaBits);

		for (int compNdx = 0; compNdx < scalarSize; compNdx++)
		{
			const float		in0			= ((const float*)inputs[0])[compNdx];
			const deUint32	out0		= ((const deUint32*)outputs[0])[compNdx];
			const deUint32	refOut0		= tcu::Float32(in0).bits();
			const int		ulpDiff		= de::abs((int)out0 - (int)refOut0);

			if (ulpDiff > maxUlpDiff)
			{
				m_failMsg << "Expected [" << compNdx << "] = " << tcu::toHex(refOut0) << " with threshold "
							<< tcu::toHex(maxUlpDiff) << ", got diff " << tcu::toHex(ulpDiff);
				return false;
			}
		}

		return true;
	}